

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

int glslang::IntLog2<int>(int n)

{
  bool bVar1;
  int local_10;
  int result;
  int n_local;
  
  bVar1 = IsPow2<int>(n);
  if (!bVar1) {
    __assert_fail("IsPow2(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Common.h"
                  ,0x129,"int glslang::IntLog2(T) [T = int]");
  }
  for (local_10 = 0; 1 << ((byte)local_10 & 0x1f) != n; local_10 = local_10 + 1) {
  }
  return local_10;
}

Assistant:

int IntLog2(T n)
{
    assert(IsPow2(n));
    int result = 0;
    while ((T(1) << result) != n) {
      result++;
    }
    return result;
}